

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O1

CURLcode protocol2num(char *str,curl_prot_t *val)

{
  int iVar1;
  CURLcode CVar2;
  char *pcVar3;
  Curl_handler *pCVar4;
  size_t len;
  
  *val = 0;
  iVar1 = curl_strequal(str,"all");
  if (iVar1 == 0) {
    do {
      pcVar3 = strchr(str,0x2c);
      if (pcVar3 == (char *)0x0) {
        len = strlen(str);
      }
      else {
        len = (long)pcVar3 - (long)str;
      }
      if (len != 0) {
        pCVar4 = Curl_getn_scheme_handler(str,len);
        if (pCVar4 == (Curl_handler *)0x0) {
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        *val = *val | pCVar4->protocol;
      }
      str = pcVar3 + 1;
    } while (pcVar3 != (char *)0x0);
    CVar2 = CURLE_BAD_FUNCTION_ARGUMENT;
    if (*val != 0) {
      CVar2 = CURLE_OK;
    }
  }
  else {
    *val = 0xffffffff;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode protocol2num(const char *str, curl_prot_t *val)
{
  /*
   * We are asked to cherry-pick protocols, so play it safe and disallow all
   * protocols to start with, and re-add the wanted ones back in.
   */
  *val = 0;

  if(!str)
    return CURLE_BAD_FUNCTION_ARGUMENT;

  if(curl_strequal(str, "all")) {
    *val = ~(curl_prot_t) 0;
    return CURLE_OK;
  }

  do {
    const char *token = str;
    size_t tlen;

    str = strchr(str, ',');
    tlen = str? (size_t) (str - token): strlen(token);
    if(tlen) {
      const struct Curl_handler *h = Curl_getn_scheme_handler(token, tlen);

      if(!h)
        return CURLE_UNSUPPORTED_PROTOCOL;

      *val |= h->protocol;
    }
  } while(str && str++);

  if(!*val)
    /* no protocol listed */
    return CURLE_BAD_FUNCTION_ARGUMENT;
  return CURLE_OK;
}